

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_descriptor_set_bindings
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *bindings,
          VkDescriptorSetLayoutBinding **out_bindings)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  VkDescriptorType VVar4;
  VkDescriptorSetLayoutBinding *pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar6;
  Type pGVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *b;
  VkSampler **out_sampler;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(bindings);
  pVVar5 = ScratchAllocator::allocate_n_cleared<VkDescriptorSetLayoutBinding>
                     (&this->allocator,(ulong)SVar2);
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(bindings);
  out_sampler = &pVVar5->pImmutableSamplers;
  while( true ) {
    pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End(bindings);
    if (this_00 == pGVar6) break;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"binding");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    ((VkDescriptorSetLayoutBinding *)(out_sampler + -2))->binding = uVar3;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"descriptorCount");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    *(uint *)(out_sampler + -1) = uVar3;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"descriptorType");
    VVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    *(VkDescriptorType *)((long)out_sampler + -0xc) = VVar4;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"stageFlags");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    *(uint *)((long)out_sampler + -4) = uVar3;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"immutableSamplers");
    if (bVar1) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"immutableSamplers");
      bVar1 = parse_immutable_samplers(this,iface,resolver,pGVar7,out_sampler);
      if (!bVar1) goto LAB_00110235;
    }
    this_00 = this_00 + 0x10;
    out_sampler = out_sampler + 3;
  }
  *out_bindings = pVVar5;
LAB_00110235:
  return this_00 == pGVar6;
}

Assistant:

bool StateReplayer::Impl::parse_descriptor_set_bindings(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                        const Value &bindings,
                                                        const VkDescriptorSetLayoutBinding **out_bindings)
{
	auto *set_bindings = allocator.allocate_n_cleared<VkDescriptorSetLayoutBinding>(bindings.Size());
	auto *ret = set_bindings;
	for (auto itr = bindings.Begin(); itr != bindings.End(); ++itr, set_bindings++)
	{
		auto &b = *itr;
		set_bindings->binding = b["binding"].GetUint();
		set_bindings->descriptorCount = b["descriptorCount"].GetUint();
		set_bindings->descriptorType = static_cast<VkDescriptorType>(b["descriptorType"].GetUint());
		set_bindings->stageFlags = b["stageFlags"].GetUint();
		if (b.HasMember("immutableSamplers"))
		{
			if (!parse_immutable_samplers(iface, resolver,
			                              b["immutableSamplers"], &set_bindings->pImmutableSamplers))
			{
				return false;
			}
		}
	}

	*out_bindings = ret;
	return true;
}